

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_meth_name(parser *p)

{
  char *pcVar1;
  void *pvVar2;
  undefined8 *v;
  blow_method *meth;
  blow_method *h;
  char *name;
  parser *p_local;
  
  pcVar1 = parser_getstr(p,"name");
  pvVar2 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x30);
  v[5] = pvVar2;
  parser_setpriv(p,v);
  pcVar1 = string_make(pcVar1);
  *v = pcVar1;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_meth_name(struct parser *p) {
	const char *name = parser_getstr(p, "name");
	struct blow_method *h = parser_priv(p);

	struct blow_method *meth = mem_zalloc(sizeof *meth);
	meth->next = h;
	parser_setpriv(p, meth);
	meth->name = string_make(name);

	return PARSE_ERROR_NONE;
}